

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

bool __thiscall
ReplayInterface::enqueue_create_sampler
          (ReplayInterface *this,Hash hash,VkSamplerCreateInfo *create_info,VkSampler *sampler)

{
  bool bVar1;
  VkSampler_T *pVVar2;
  VkSamplerCreateInfo *local_38;
  Hash recorded_hash;
  VkSampler *sampler_local;
  VkSamplerCreateInfo *create_info_local;
  Hash hash_local;
  ReplayInterface *this_local;
  
  recorded_hash = (Hash)sampler;
  sampler_local = (VkSampler *)create_info;
  create_info_local = (VkSamplerCreateInfo *)hash;
  hash_local = (Hash)this;
  bVar1 = Fossilize::Hashing::compute_hash_sampler(create_info,(Hash *)&local_38);
  if (bVar1) {
    if (local_38 == create_info_local) {
      pVVar2 = fake_handle<VkSampler_T*>((uint64_t)create_info_local);
      *(VkSampler_T **)recorded_hash = pVVar2;
      this_local._7_1_ =
           Fossilize::StateRecorder::record_sampler
                     (&this->recorder,*(VkSampler *)recorded_hash,
                      (VkSamplerCreateInfo *)sampler_local,0);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool enqueue_create_sampler(Hash hash, const VkSamplerCreateInfo *create_info, VkSampler *sampler) override
	{
		Hash recorded_hash;
		if (!Hashing::compute_hash_sampler(*create_info, &recorded_hash))
			return false;
		if (recorded_hash != hash)
			return false;

		*sampler = fake_handle<VkSampler>(hash);
		return recorder.record_sampler(*sampler, *create_info);
	}